

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void unpack_cell(int i,int j,int k,vector<int,_std::allocator<int>_> *particle_numbers,
                size_t *pn_index,vector<particle,_std::allocator<particle>_> *particles,
                size_t *p_index)

{
  double __n;
  cellp ***pppcVar1;
  reference pvVar2;
  particle *__dest;
  reference __src;
  spatial_region *in_RCX;
  int in_EDX;
  int in_ESI;
  size_type *in_R8;
  vector<particle,_std::allocator<particle>_> *in_R9;
  particle *tmp;
  int ii;
  plist *pl;
  int in_stack_ffffffffffffffbc;
  field3d<cellp> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar3;
  int iVar4;
  spatial_region *this;
  
  std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
            ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x1472b0);
  pppcVar1 = field3d<cellp>::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  this = (spatial_region *)((*pppcVar1)[in_ESI] + in_EDX);
  std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
            ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x1472ec);
  spatial_region::erase(this,(plist *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
  ;
  iVar3 = 0;
  while( true ) {
    iVar4 = iVar3;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)in_RCX,*in_R8);
    if (*pvVar2 <= iVar3) break;
    std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
              ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x147332);
    __dest = spatial_region::new_particle(in_RCX);
    __n = tmp->x;
    tmp->x = (double)((long)__n + 1);
    __src = std::vector<particle,_std::allocator<particle>_>::operator[](in_R9,(size_type)__n);
    memcpy(__dest,__src,0x68);
    __dest->previous = *(particle **)&this->nz;
    *(particle **)&this->nz = __dest;
    iVar3 = iVar4 + 1;
  }
  this->nx = 0;
  this->ny = 0;
  while (*(long *)&this->nz != 0) {
    *(undefined8 *)(*(long *)&this->nz + 0x58) = *(undefined8 *)this;
    this->nx = this->nz;
    this->ny = *(undefined4 *)&this->field_0xc;
    *(undefined8 *)&this->nz = *(undefined8 *)(*(long *)&this->nz + 0x60);
  }
  this->nz = this->nx;
  *(int *)&this->field_0xc = this->ny;
  *in_R8 = *in_R8 + 1;
  return;
}

Assistant:

void unpack_cell(int i, int j, int k, vector<int> & particle_numbers, size_t & pn_index, vector<particle> & particles, size_t & p_index) {
    plist & pl = psr->cp[i][j][k].pl;
    psr->erase(pl);

    for (int ii=0; ii<particle_numbers[pn_index]; ii++) {
        particle * tmp = psr->new_particle();
        *tmp = particles[p_index++];
        tmp->previous = pl.start;
        pl.start = tmp;
    }
    pl.head = 0;
    while (pl.start != 0) {
        pl.start->next = pl.head;
        pl.head = pl.start;
        pl.start = pl.start->previous;
    }
    pl.start = pl.head;

    pn_index++;
}